

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O2

edge_vec * __thiscall
Hypergraph::enumerate_legacy(edge_vec *__return_storage_ptr__,Hypergraph *this)

{
  rep rVar1;
  allocator<unsigned_long> local_52;
  allocator<unsigned_long> local_51;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->m_configuration).collect_hitting_set_statistics == true) {
    rVar1 = std::chrono::_V2::system_clock::now();
    (this->m_hitting_set_timestamp).__d.__r = rVar1;
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_30,(long)this->m_num_vertices,0,&local_51);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_50,(long)this->m_num_vertices,0,&local_52);
  enumerate_legacy(this,&local_30,&local_50,0,__return_storage_ptr__);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_50);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_30);
  return __return_storage_ptr__;
}

Assistant:

edge_vec Hypergraph::enumerate_legacy() {
	edge_vec minimal_hitting_sets;
	if (m_configuration.collect_hitting_set_statistics) m_hitting_set_timestamp = Clock::now();
	enumerate_legacy(edge(m_num_vertices), edge(m_num_vertices), 0, minimal_hitting_sets);
	return minimal_hitting_sets;
}